

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void set_size_independent_vars(AV1_COMP *cpi)

{
  _Bool _Var1;
  AV1_COMP *cpi_00;
  long in_RDI;
  FeatureFlags *features;
  AV1_COMMON *cm;
  int i;
  int local_c;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0x3c16c);
  for (local_c = 1; local_c < 8; local_c = local_c + 1) {
    memcpy((void *)(in_RDI + 0x41ee4 + (long)local_c * 0x24),&default_warp_params,0x24);
  }
  *(undefined1 *)(in_RDI + 0x60640) = 0;
  av1_set_speed_features_framesize_independent((AV1_COMP *)cm,features._4_4_);
  av1_set_rd_speed_thresholds(cpi_00);
  cpi_00->field_0xd = 4;
  _Var1 = is_switchable_motion_mode_allowed
                    ((_Bool)(*(byte *)((long)&cpi_00->ppi + 5) & 1),
                     (_Bool)(*(byte *)(in_RDI + 0x426e6) & 1));
  cpi_00->field_0xb = _Var1;
  return;
}

Assistant:

static inline void set_size_independent_vars(AV1_COMP *cpi) {
  int i;
  AV1_COMMON *const cm = &cpi->common;
  FeatureFlags *const features = &cm->features;
  for (i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    cm->global_motion[i] = default_warp_params;
  }
  cpi->gm_info.search_done = 0;

  av1_set_speed_features_framesize_independent(cpi, cpi->speed);
  av1_set_rd_speed_thresholds(cpi);
  features->interp_filter = SWITCHABLE;
  features->switchable_motion_mode = is_switchable_motion_mode_allowed(
      features->allow_warped_motion, cpi->oxcf.motion_mode_cfg.enable_obmc);
}